

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O0

cupdlp_retcode
getUserParam(int argc,char **argv,cupdlp_bool *ifChangeIntParam,cupdlp_int *intParam,
            cupdlp_bool *ifChangeFloatParam,cupdlp_float *floatParam)

{
  int iVar1;
  int *in_RCX;
  undefined1 *in_RDX;
  long in_RSI;
  int in_EDI;
  undefined1 *in_R8;
  double *in_R9;
  double dVar2;
  cupdlp_int i_2;
  cupdlp_int i_1;
  cupdlp_int i;
  cupdlp_retcode retcode;
  int local_40;
  int local_3c;
  int local_38;
  
  for (local_38 = 0; local_38 < 0xc; local_38 = local_38 + 1) {
    in_RDX[local_38] = 0;
  }
  for (local_3c = 0; local_3c < 6; local_3c = local_3c + 1) {
    in_R8[local_3c] = 0;
  }
  local_40 = 0;
  while( true ) {
    if (in_EDI + -1 <= local_40) {
      return 0;
    }
    iVar1 = strcmp(*(char **)(in_RSI + (long)local_40 * 8),"-h");
    if (iVar1 == 0) break;
    iVar1 = strcmp(*(char **)(in_RSI + (long)local_40 * 8),"-nIterLim");
    if (iVar1 == 0) {
      *in_RDX = 1;
      iVar1 = atoi(*(char **)(in_RSI + (long)(local_40 + 1) * 8));
      *in_RCX = iVar1;
    }
    else {
      iVar1 = strcmp(*(char **)(in_RSI + (long)local_40 * 8),"-ifScaling");
      if (iVar1 == 0) {
        in_RDX[1] = 1;
        iVar1 = atoi(*(char **)(in_RSI + (long)(local_40 + 1) * 8));
        in_RCX[1] = iVar1;
      }
      else {
        iVar1 = strcmp(*(char **)(in_RSI + (long)local_40 * 8),"-iScalingMethod");
        if (iVar1 == 0) {
          in_RDX[2] = 1;
          iVar1 = atoi(*(char **)(in_RSI + (long)(local_40 + 1) * 8));
          in_RCX[2] = iVar1;
        }
        else {
          iVar1 = strcmp(*(char **)(in_RSI + (long)local_40 * 8),"-eLineSearchMethod");
          if (iVar1 == 0) {
            in_RDX[3] = 1;
            iVar1 = atoi(*(char **)(in_RSI + (long)(local_40 + 1) * 8));
            in_RCX[3] = iVar1;
          }
          else {
            iVar1 = strcmp(*(char **)(in_RSI + (long)local_40 * 8),"-dScalingLimit");
            if (iVar1 == 0) {
              *in_R8 = 1;
              dVar2 = atof(*(char **)(in_RSI + (long)(local_40 + 1) * 8));
              *in_R9 = dVar2;
            }
            else {
              iVar1 = strcmp(*(char **)(in_RSI + (long)local_40 * 8),"-dPrimalTol");
              if (iVar1 == 0) {
                in_R8[1] = 1;
                dVar2 = atof(*(char **)(in_RSI + (long)(local_40 + 1) * 8));
                in_R9[1] = dVar2;
              }
              else {
                iVar1 = strcmp(*(char **)(in_RSI + (long)local_40 * 8),"-dDualTol");
                if (iVar1 == 0) {
                  in_R8[2] = 1;
                  dVar2 = atof(*(char **)(in_RSI + (long)(local_40 + 1) * 8));
                  in_R9[2] = dVar2;
                }
                else {
                  iVar1 = strcmp(*(char **)(in_RSI + (long)local_40 * 8),"-dGapTol");
                  if (iVar1 == 0) {
                    in_R8[3] = 1;
                    dVar2 = atof(*(char **)(in_RSI + (long)(local_40 + 1) * 8));
                    in_R9[3] = dVar2;
                  }
                  else {
                    iVar1 = strcmp(*(char **)(in_RSI + (long)local_40 * 8),"-dFeasTol");
                    if (iVar1 == 0) {
                      in_R8[4] = 1;
                      dVar2 = atof(*(char **)(in_RSI + (long)(local_40 + 1) * 8));
                      in_R9[4] = dVar2;
                    }
                    else {
                      iVar1 = strcmp(*(char **)(in_RSI + (long)local_40 * 8),"-dTimeLim");
                      if (iVar1 == 0) {
                        in_R8[5] = 1;
                        dVar2 = atof(*(char **)(in_RSI + (long)(local_40 + 1) * 8));
                        in_R9[5] = dVar2;
                      }
                      else {
                        iVar1 = strcmp(*(char **)(in_RSI + (long)local_40 * 8),"-eRestartMethod");
                        if (iVar1 == 0) {
                          in_RDX[4] = 1;
                          iVar1 = atoi(*(char **)(in_RSI + (long)(local_40 + 1) * 8));
                          in_RCX[4] = iVar1;
                        }
                        else {
                          iVar1 = strcmp(*(char **)(in_RSI + (long)local_40 * 8),"-ifRuizScaling");
                          if (iVar1 == 0) {
                            in_RDX[5] = 1;
                            iVar1 = atoi(*(char **)(in_RSI + (long)(local_40 + 1) * 8));
                            in_RCX[5] = iVar1;
                          }
                          else {
                            iVar1 = strcmp(*(char **)(in_RSI + (long)local_40 * 8),"-ifL2Scaling");
                            if (iVar1 == 0) {
                              in_RDX[6] = 1;
                              iVar1 = atoi(*(char **)(in_RSI + (long)(local_40 + 1) * 8));
                              in_RCX[6] = iVar1;
                            }
                            else {
                              iVar1 = strcmp(*(char **)(in_RSI + (long)local_40 * 8),"-ifPcScaling")
                              ;
                              if (iVar1 == 0) {
                                in_RDX[7] = 1;
                                iVar1 = atoi(*(char **)(in_RSI + (long)(local_40 + 1) * 8));
                                in_RCX[7] = iVar1;
                              }
                              else {
                                iVar1 = strcmp(*(char **)(in_RSI + (long)local_40 * 8),"-nLogLevel")
                                ;
                                if (iVar1 == 0) {
                                  in_RDX[8] = 1;
                                  iVar1 = atoi(*(char **)(in_RSI + (long)(local_40 + 1) * 8));
                                  in_RCX[8] = iVar1;
                                }
                                else {
                                  iVar1 = strcmp(*(char **)(in_RSI + (long)local_40 * 8),"-nLogInt")
                                  ;
                                  if (iVar1 == 0) {
                                    in_RDX[9] = 1;
                                    iVar1 = atoi(*(char **)(in_RSI + (long)(local_40 + 1) * 8));
                                    in_RCX[9] = iVar1;
                                  }
                                  else {
                                    iVar1 = strcmp(*(char **)(in_RSI + (long)local_40 * 8),"-ifPre")
                                    ;
                                    if (iVar1 == 0) {
                                      in_RDX[10] = 1;
                                      iVar1 = atoi(*(char **)(in_RSI + (long)(local_40 + 1) * 8));
                                      in_RCX[10] = iVar1;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    local_40 = local_40 + 1;
  }
  PDHG_PrintUserParamHelper();
  return 1;
}

Assistant:

cupdlp_retcode getUserParam(int argc, char **argv,
                            cupdlp_bool *ifChangeIntParam, cupdlp_int *intParam,
                            cupdlp_bool *ifChangeFloatParam,
                            cupdlp_float *floatParam) {
  cupdlp_retcode retcode = RETCODE_OK;

  // set ifChangeIntParam and ifChangeFloatParam to false
  for (cupdlp_int i = 0; i < N_INT_USER_PARAM; ++i) {
    ifChangeIntParam[i] = false;
  }

  for (cupdlp_int i = 0; i < N_FLOAT_USER_PARAM; ++i) {
    ifChangeFloatParam[i] = false;
  }

  // parse command line arguments
  for (cupdlp_int i = 0; i < argc - 1; ++i) {
    if (strcmp(argv[i], "-h") == 0) {
      PDHG_PrintUserParamHelper();

      retcode = RETCODE_FAILED;
      goto exit_cleanup;
    }

    if (strcmp(argv[i], "-nIterLim") == 0) {
      ifChangeIntParam[N_ITER_LIM] = true;
      intParam[N_ITER_LIM] = atoi(argv[i + 1]);
    } else if (strcmp(argv[i], "-ifScaling") == 0) {
      ifChangeIntParam[IF_SCALING] = true;
      intParam[IF_SCALING] = atoi(argv[i + 1]);
    } else if (strcmp(argv[i], "-iScalingMethod") == 0) {
      ifChangeIntParam[I_SCALING_METHOD] = true;
      intParam[I_SCALING_METHOD] = atoi(argv[i + 1]);
    } else if (strcmp(argv[i], "-eLineSearchMethod") == 0) {
      ifChangeIntParam[E_LINE_SEARCH_METHOD] = true;
      intParam[E_LINE_SEARCH_METHOD] = atoi(argv[i + 1]);
    } else if (strcmp(argv[i], "-dScalingLimit") == 0) {
      ifChangeFloatParam[D_SCALING_LIMIT] = true;
      floatParam[D_SCALING_LIMIT] = atof(argv[i + 1]);
    } else if (strcmp(argv[i], "-dPrimalTol") == 0) {
      ifChangeFloatParam[D_PRIMAL_TOL] = true;
      floatParam[D_PRIMAL_TOL] = atof(argv[i + 1]);
    } else if (strcmp(argv[i], "-dDualTol") == 0) {
      ifChangeFloatParam[D_DUAL_TOL] = true;
      floatParam[D_DUAL_TOL] = atof(argv[i + 1]);
    } else if (strcmp(argv[i], "-dGapTol") == 0) {
      ifChangeFloatParam[D_GAP_TOL] = true;
      floatParam[D_GAP_TOL] = atof(argv[i + 1]);
    } else if (strcmp(argv[i], "-dFeasTol") == 0) {
      ifChangeFloatParam[D_FEAS_TOL] = true;
      floatParam[D_FEAS_TOL] = atof(argv[i + 1]);
    } else if (strcmp(argv[i], "-dTimeLim") == 0) {
      ifChangeFloatParam[D_TIME_LIM] = true;
      floatParam[D_TIME_LIM] = atof(argv[i + 1]);
    } else if (strcmp(argv[i], "-eRestartMethod") == 0) {
      ifChangeIntParam[E_RESTART_METHOD] = true;
      intParam[E_RESTART_METHOD] = atoi(argv[i + 1]);
    } else if (strcmp(argv[i], "-ifRuizScaling") == 0) {
      ifChangeIntParam[IF_RUIZ_SCALING] = true;
      intParam[IF_RUIZ_SCALING] = atoi(argv[i + 1]);
    } else if (strcmp(argv[i], "-ifL2Scaling") == 0) {
      ifChangeIntParam[IF_L2_SCALING] = true;
      intParam[IF_L2_SCALING] = atoi(argv[i + 1]);
    } else if (strcmp(argv[i], "-ifPcScaling") == 0) {
      ifChangeIntParam[IF_PC_SCALING] = true;
      intParam[IF_PC_SCALING] = atoi(argv[i + 1]);
    } else if (strcmp(argv[i], "-nLogLevel") == 0) {
      ifChangeIntParam[N_LOG_LEVEL] = true;
      intParam[N_LOG_LEVEL] = atoi(argv[i + 1]);
    } else if (strcmp(argv[i], "-nLogInt") == 0) {
      ifChangeIntParam[N_LOG_INTERVAL] = true;
      intParam[N_LOG_INTERVAL] = atoi(argv[i + 1]);
    } else if (strcmp(argv[i], "-ifPre") == 0) {
      ifChangeIntParam[IF_PRESOLVE] = true;
      intParam[IF_PRESOLVE] = atoi(argv[i + 1]);
    }
  }

  // if (argc>0) {
  //   if (strcmp(argv[argc - 1], "-h") == 0) {
  //     PDHG_PrintUserParamHelper();
      
  //     retcode = RETCODE_FAILED;
  //     goto exit_cleanup;
  //   }
  // }

exit_cleanup:
  return retcode;
}